

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

bool __thiscall TasgridWrapper::readGridfile(TasgridWrapper *this)

{
  int iVar1;
  TypeOneDRule TVar2;
  size_t in_RCX;
  void *in_RDX;
  runtime_error *e;
  TasgridWrapper *this_local;
  
  TasGrid::TasmanianSparseGrid::read(&this->grid,(int)this + 0x160,in_RDX,in_RCX);
  iVar1 = TasGrid::TasmanianSparseGrid::getNumDimensions(&this->grid);
  this->num_dimensions = iVar1;
  iVar1 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
  this->num_outputs = iVar1;
  TVar2 = TasGrid::TasmanianSparseGrid::getRule();
  this->rule = TVar2;
  return true;
}

Assistant:

bool TasgridWrapper::readGridfile(){
    try{
        grid.read(gridfilename);
    }catch(std::runtime_error &e){
        cerr << e.what() << "\n";
        return false;
    }
    num_dimensions = grid.getNumDimensions();
    num_outputs = grid.getNumOutputs();
    rule = grid.getRule();
    return true;
}